

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O0

void Aig_ManPrintStats(Aig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int nChoices;
  Aig_Man_t *p_local;
  
  uVar1 = Aig_ManChoiceNum(p);
  printf("%-15s : ",p->pName);
  iVar2 = Aig_ManCiNum(p);
  iVar3 = Aig_ManRegNum(p);
  printf("pi = %5d  ",(ulong)(uint)(iVar2 - iVar3));
  iVar2 = Aig_ManCoNum(p);
  iVar3 = Aig_ManRegNum(p);
  printf("po = %5d  ",(ulong)(uint)(iVar2 - iVar3));
  iVar2 = Aig_ManRegNum(p);
  if (iVar2 != 0) {
    uVar4 = Aig_ManRegNum(p);
    printf("lat = %5d  ",(ulong)uVar4);
  }
  uVar4 = Aig_ManAndNum(p);
  printf("and = %7d  ",(ulong)uVar4);
  iVar2 = Aig_ManExorNum(p);
  if (iVar2 != 0) {
    uVar4 = Aig_ManExorNum(p);
    printf("xor = %5d  ",(ulong)uVar4);
  }
  if (uVar1 != 0) {
    printf("ch = %5d  ",(ulong)uVar1);
  }
  iVar2 = Aig_ManBufNum(p);
  if (iVar2 != 0) {
    uVar1 = Aig_ManBufNum(p);
    printf("buf = %5d  ",(ulong)uVar1);
  }
  uVar1 = Aig_ManLevels(p);
  printf("lev = %3d",(ulong)uVar1);
  printf("\n");
  fflush(_stdout);
  return;
}

Assistant:

void Aig_ManPrintStats( Aig_Man_t * p )
{
    int nChoices = Aig_ManChoiceNum(p);
    printf( "%-15s : ",      p->pName );
    printf( "pi = %5d  ",    Aig_ManCiNum(p)-Aig_ManRegNum(p) );
    printf( "po = %5d  ",    Aig_ManCoNum(p)-Aig_ManRegNum(p) );
    if ( Aig_ManRegNum(p) )
    printf( "lat = %5d  ", Aig_ManRegNum(p) );
    printf( "and = %7d  ",   Aig_ManAndNum(p) );
//    printf( "Eq = %7d  ",     Aig_ManHaigCounter(p) );
    if ( Aig_ManExorNum(p) )
    printf( "xor = %5d  ",    Aig_ManExorNum(p) );
    if ( nChoices )
    printf( "ch = %5d  ",  nChoices );
    if ( Aig_ManBufNum(p) )
    printf( "buf = %5d  ",    Aig_ManBufNum(p) );
//    printf( "Cre = %6d  ",  p->nCreated );
//    printf( "Del = %6d  ",  p->nDeleted );
//    printf( "Lev = %3d  ",  Aig_ManLevelNum(p) );
//    printf( "Max = %7d  ",  Aig_ManObjNumMax(p) );
    printf( "lev = %3d",  Aig_ManLevels(p) );
    printf( "\n" );
    fflush( stdout );
}